

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_a15f78::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmLocalGenerator *this_00;
  cmOutputConverter *outputConverter;
  allocator<char> local_289;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_288;
  string local_258;
  Value local_238;
  string linkLibs;
  string linkPath;
  string frameworkPath;
  string linkFlags;
  string linkLanguageFlags;
  cmListFileBacktrace local_168;
  cmListFileBacktrace local_158;
  cmListFileBacktrace local_148;
  cmListFileBacktrace local_138;
  cmListFileBacktrace local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  cmLinkLineComputer linkLineComputer;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  paVar1 = &linkLanguageFlags.field_2;
  linkLanguageFlags._M_string_length = 0;
  paVar2 = &linkFlags.field_2;
  linkFlags._M_string_length = 0;
  paVar3 = &frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkLanguageFlags.field_2._M_local_buf[0] = '\0';
  linkFlags.field_2._M_local_buf[0] = '\0';
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  linkLibs.field_2._M_local_buf[0] = '\0';
  frameworkPath._M_dataplus._M_p = (pointer)paVar3;
  linkFlags._M_dataplus._M_p = (pointer)paVar2;
  linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  outputConverter = &this_00->super_cmOutputConverter;
  if (this_00 == (cmLocalGenerator *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_238,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&local_288,(cmStateSnapshot *)&local_238);
  cmLinkLineComputer::cmLinkLineComputer
            (&linkLineComputer,outputConverter,(cmStateDirectory *)&local_288);
  cmLocalGenerator::GetTargetFlags
            (this_00,&linkLineComputer,this->Config,&linkLibs,&linkLanguageFlags,&linkFlags,
             &frameworkPath,&linkPath,this->GT);
  cmSystemTools::TrimWhitespace(&local_288.Value,&linkLanguageFlags);
  std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  cmSystemTools::TrimWhitespace(&local_288.Value,&linkFlags);
  std::__cxx11::string::operator=((string *)&linkFlags,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  cmSystemTools::TrimWhitespace(&local_288.Value,&frameworkPath);
  std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  cmSystemTools::TrimWhitespace(&local_288.Value,&linkPath);
  std::__cxx11::string::operator=((string *)&linkPath,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  cmSystemTools::TrimWhitespace(&local_288.Value,&linkLibs);
  std::__cxx11::string::operator=((string *)&linkLibs,(string *)&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  if (linkLanguageFlags._M_string_length != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguageFlags._M_dataplus._M_p == paVar1) {
      local_90.field_2._8_8_ = linkLanguageFlags.field_2._8_8_;
    }
    else {
      local_90._M_dataplus._M_p = linkLanguageFlags._M_dataplus._M_p;
    }
    local_90.field_2._M_allocated_capacity._1_7_ =
         linkLanguageFlags.field_2._M_allocated_capacity._1_7_;
    local_90.field_2._M_local_buf[0] = linkLanguageFlags.field_2._M_local_buf[0];
    local_90._M_string_length = linkLanguageFlags._M_string_length;
    linkLanguageFlags._M_string_length = 0;
    linkLanguageFlags.field_2._M_local_buf[0] = '\0';
    local_128.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_128.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_288,&local_90,&local_128);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"flags",&local_289);
    DumpCommandFragment(&local_238,this,&local_288,&local_258);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_128.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (linkFlags._M_string_length != 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkFlags._M_dataplus._M_p == paVar2) {
      local_b0.field_2._8_8_ = linkFlags.field_2._8_8_;
    }
    else {
      local_b0._M_dataplus._M_p = linkFlags._M_dataplus._M_p;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = linkFlags.field_2._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = linkFlags.field_2._M_local_buf[0];
    local_b0._M_string_length = linkFlags._M_string_length;
    linkFlags._M_string_length = 0;
    linkFlags.field_2._M_local_buf[0] = '\0';
    local_138.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_138.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    linkFlags._M_dataplus._M_p = (pointer)paVar2;
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_288,&local_b0,&local_138);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"flags",&local_289);
    DumpCommandFragment(&local_238,this,&local_288,&local_258);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_138.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (frameworkPath._M_string_length != 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p == paVar3) {
      local_d0.field_2._8_8_ = frameworkPath.field_2._8_8_;
    }
    else {
      local_d0._M_dataplus._M_p = frameworkPath._M_dataplus._M_p;
    }
    local_d0.field_2._M_allocated_capacity._1_7_ = frameworkPath.field_2._M_allocated_capacity._1_7_
    ;
    local_d0.field_2._M_local_buf[0] = frameworkPath.field_2._M_local_buf[0];
    local_d0._M_string_length = frameworkPath._M_string_length;
    frameworkPath._M_string_length = 0;
    frameworkPath.field_2._M_local_buf[0] = '\0';
    local_148.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_148.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    frameworkPath._M_dataplus._M_p = (pointer)paVar3;
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_288,&local_d0,&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"frameworkPath",&local_289);
    DumpCommandFragment(&local_238,this,&local_288,&local_258);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_148.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  if (linkPath._M_string_length != 0) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkPath._M_dataplus._M_p == &linkPath.field_2) {
      local_f0.field_2._8_8_ = linkPath.field_2._8_8_;
    }
    else {
      local_f0._M_dataplus._M_p = linkPath._M_dataplus._M_p;
    }
    local_f0.field_2._M_allocated_capacity._1_7_ = linkPath.field_2._M_allocated_capacity._1_7_;
    local_f0.field_2._M_local_buf[0] = linkPath.field_2._M_local_buf[0];
    local_f0._M_string_length = linkPath._M_string_length;
    linkPath._M_string_length = 0;
    linkPath.field_2._M_local_buf[0] = '\0';
    local_158.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_158.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_288,&local_f0,&local_158);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"libraryPath",&local_289);
    DumpCommandFragment(&local_238,this,&local_288,&local_258);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_158.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  if (linkLibs._M_string_length != 0) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLibs._M_dataplus._M_p == &linkLibs.field_2) {
      local_110.field_2._8_8_ = linkLibs.field_2._8_8_;
    }
    else {
      local_110._M_dataplus._M_p = linkLibs._M_dataplus._M_p;
    }
    local_110.field_2._M_allocated_capacity._1_7_ = linkLibs.field_2._M_allocated_capacity._1_7_;
    local_110.field_2._M_local_buf[0] = linkLibs.field_2._M_local_buf[0];
    local_110._M_string_length = linkLibs._M_string_length;
    linkLibs._M_string_length = 0;
    linkLibs.field_2._M_local_buf[0] = '\0';
    local_168.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_168.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_288,&local_110,&local_168);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"libraries",&local_289);
    DumpCommandFragment(&local_238,this,&local_288,&local_258);
    Json::Value::append(__return_storage_ptr__,&local_238);
    Json::Value::~Value(&local_238);
    std::__cxx11::string::~string((string *)&local_258);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_288);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_168.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&local_110);
  }
  cmLinkLineComputer::~cmLinkLineComputer(&linkLineComputer);
  std::__cxx11::string::~string((string *)&linkLibs);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  std::__cxx11::string::~string((string *)&linkFlags);
  std::__cxx11::string::~string((string *)&linkLanguageFlags);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::string linkFlags;
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmLinkLineComputer linkLineComputer(lg,
                                      lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(&linkLineComputer, this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmSystemTools::TrimWhitespace(linkLanguageFlags);
  linkFlags = cmSystemTools::TrimWhitespace(linkFlags);
  frameworkPath = cmSystemTools::TrimWhitespace(frameworkPath);
  linkPath = cmSystemTools::TrimWhitespace(linkPath);
  linkLibs = cmSystemTools::TrimWhitespace(linkLibs);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkFlags), "flags"));
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkPath), "libraryPath"));
  }

  if (!linkLibs.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLibs), "libraries"));
  }

  return linkFragments;
}